

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O1

int __thiscall
google::protobuf::compiler::CodeGeneratorResponse::ByteSize(CodeGeneratorResponse *this)

{
  string *psVar1;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  
  iVar3 = 0;
  if ((this->_has_bits_[0] & 1) != 0) {
    psVar1 = this->error_;
    uVar4 = (uint)psVar1->_M_string_length;
    iVar3 = 2;
    if (0x7f < uVar4) {
      iVar3 = io::CodedOutputStream::VarintSize32Fallback(uVar4);
      iVar3 = iVar3 + 1;
    }
    iVar3 = iVar3 + (int)psVar1->_M_string_length;
  }
  iVar5 = (this->file_).super_RepeatedPtrFieldBase.current_size_;
  iVar3 = iVar3 + iVar5;
  if (0 < iVar5) {
    lVar6 = 0;
    do {
      uVar4 = CodeGeneratorResponse_File::ByteSize
                        ((CodeGeneratorResponse_File *)
                         (this->file_).super_RepeatedPtrFieldBase.elements_[lVar6]);
      iVar5 = 1;
      if (0x7f < uVar4) {
        iVar5 = io::CodedOutputStream::VarintSize32Fallback(uVar4);
      }
      iVar3 = iVar3 + uVar4 + iVar5;
      lVar6 = lVar6 + 1;
    } while (lVar6 < (this->file_).super_RepeatedPtrFieldBase.current_size_);
  }
  pvVar2 = (this->_unknown_fields_).fields_;
  if ((pvVar2 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                  *)0x0) &&
     ((pvVar2->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (pvVar2->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    iVar5 = internal::WireFormat::ComputeUnknownFieldsSize(&this->_unknown_fields_);
    iVar3 = iVar3 + iVar5;
  }
  this->_cached_size_ = iVar3;
  return iVar3;
}

Assistant:

int CodeGeneratorResponse::ByteSize() const {
  int total_size = 0;

  if (_has_bits_[0 / 32] & (0xffu << (0 % 32))) {
    // optional string error = 1;
    if (has_error()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->error());
    }

  }
  // repeated .google.protobuf.compiler.CodeGeneratorResponse.File file = 15;
  total_size += 1 * this->file_size();
  for (int i = 0; i < this->file_size(); i++) {
    total_size +=
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        this->file(i));
  }

  if (!unknown_fields().empty()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = total_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}